

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expanddims.cpp
# Opt level: O3

int __thiscall
ncnn::ExpandDims::forward(ExpandDims *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  void *pvVar1;
  int *piVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  long lVar7;
  long lVar8;
  int _h;
  int iVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  Mat local_90;
  int local_48;
  int local_44;
  Option *local_40;
  Mat *local_38;
  
  iVar6 = bottom_blob->dims;
  pvVar1 = (this->axes).data;
  if ((pvVar1 == (void *)0x0) || ((long)(this->axes).c * (this->axes).cstep == 0)) {
    bVar11 = this->expand_w != 0;
    bVar12 = this->expand_h != 0;
    bVar13 = this->expand_c != 0;
  }
  else {
    lVar7 = (long)(this->axes).w;
    if (lVar7 < 1) {
      bVar11 = false;
      bVar12 = false;
      bVar13 = false;
    }
    else {
      lVar8 = 0;
      bVar13 = false;
      bVar12 = false;
      bVar11 = false;
      do {
        bVar10 = iVar6 == 2;
        iVar9 = *(int *)((long)pvVar1 + lVar8 * 4);
        iVar9 = (iVar9 >> 0x1f & iVar6 + 1U) + iVar9;
        bVar13 = (bool)(bVar13 | (iVar9 == 0 && bVar10));
        bVar12 = (bool)(bVar12 | (iVar9 == 1 && bVar10 || iVar6 == 1 && iVar9 == 0));
        bVar11 = (bool)(bVar11 | (iVar9 == 2 && bVar10 || iVar6 == 1 && iVar9 == 1));
        lVar8 = lVar8 + 1;
      } while (lVar7 != lVar8);
    }
  }
  iVar9 = bottom_blob->w;
  _h = bottom_blob->h;
  local_40 = opt;
  local_38 = top_blob;
  if (top_blob != bottom_blob) {
    piVar2 = bottom_blob->refcount;
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + 1;
      UNLOCK();
    }
    piVar2 = top_blob->refcount;
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + -1;
      UNLOCK();
      if (*piVar2 == 0) {
        if (top_blob->allocator == (Allocator *)0x0) {
          if (top_blob->data != (void *)0x0) {
            local_48 = _h;
            local_44 = iVar9;
            free(top_blob->data);
            _h = local_48;
            iVar9 = local_44;
          }
        }
        else {
          local_48 = _h;
          local_44 = iVar9;
          (*top_blob->allocator->_vptr_Allocator[3])();
          _h = local_48;
          iVar9 = local_44;
        }
      }
    }
    top_blob->cstep = 0;
    top_blob->data = (void *)0x0;
    top_blob->refcount = (int *)0x0;
    *(undefined8 *)((long)&top_blob->refcount + 4) = 0;
    *(undefined8 *)((long)&top_blob->elemsize + 4) = 0;
    top_blob->dims = 0;
    top_blob->w = 0;
    top_blob->h = 0;
    top_blob->d = 0;
    top_blob->c = 0;
    piVar2 = bottom_blob->refcount;
    top_blob->data = bottom_blob->data;
    top_blob->refcount = piVar2;
    top_blob->elemsize = bottom_blob->elemsize;
    top_blob->elempack = bottom_blob->elempack;
    top_blob->allocator = bottom_blob->allocator;
    iVar3 = bottom_blob->w;
    iVar4 = bottom_blob->h;
    iVar5 = bottom_blob->d;
    top_blob->dims = bottom_blob->dims;
    top_blob->w = iVar3;
    top_blob->h = iVar4;
    top_blob->d = iVar5;
    top_blob->c = bottom_blob->c;
    top_blob->cstep = bottom_blob->cstep;
  }
  if (iVar6 == 2) {
    if (bVar11) {
      Mat::reshape(&local_90,bottom_blob,1,iVar9,_h,local_40->blob_allocator);
      if (&local_90 != top_blob) {
        if (local_90.refcount != (int *)0x0) {
          LOCK();
          *local_90.refcount = *local_90.refcount + 1;
          UNLOCK();
        }
        piVar2 = top_blob->refcount;
        if (piVar2 != (int *)0x0) {
          LOCK();
          *piVar2 = *piVar2 + -1;
          UNLOCK();
          if (*piVar2 == 0) {
            if (top_blob->allocator == (Allocator *)0x0) {
              if (top_blob->data != (void *)0x0) {
                free(top_blob->data);
              }
            }
            else {
              (*top_blob->allocator->_vptr_Allocator[3])();
            }
          }
        }
        top_blob->data = local_90.data;
        top_blob->refcount = local_90.refcount;
        top_blob->elemsize = local_90.elemsize;
        top_blob->elempack = local_90.elempack;
        top_blob->allocator = local_90.allocator;
        top_blob->dims = local_90.dims;
        top_blob->w = local_90.w;
        top_blob->h = local_90.h;
        top_blob->d = local_90.d;
        top_blob->c = local_90.c;
        top_blob->cstep = local_90.cstep;
      }
      if (local_90.refcount == (int *)0x0) goto LAB_004457a6;
      LOCK();
      *local_90.refcount = *local_90.refcount + -1;
      UNLOCK();
      if (*local_90.refcount != 0) goto LAB_004457a6;
      if (local_90.allocator != (Allocator *)0x0) {
        (*(local_90.allocator)->_vptr_Allocator[3])();
        goto LAB_004457a6;
      }
    }
    else if (bVar12) {
      Mat::reshape(&local_90,bottom_blob,iVar9,1,_h,local_40->blob_allocator);
      if (&local_90 != top_blob) {
        if (local_90.refcount != (int *)0x0) {
          LOCK();
          *local_90.refcount = *local_90.refcount + 1;
          UNLOCK();
        }
        piVar2 = top_blob->refcount;
        if (piVar2 != (int *)0x0) {
          LOCK();
          *piVar2 = *piVar2 + -1;
          UNLOCK();
          if (*piVar2 == 0) {
            if (top_blob->allocator == (Allocator *)0x0) {
              if (top_blob->data != (void *)0x0) {
                free(top_blob->data);
              }
            }
            else {
              (*top_blob->allocator->_vptr_Allocator[3])();
            }
          }
        }
        top_blob->data = local_90.data;
        top_blob->refcount = local_90.refcount;
        top_blob->elemsize = local_90.elemsize;
        top_blob->elempack = local_90.elempack;
        top_blob->allocator = local_90.allocator;
        top_blob->dims = local_90.dims;
        top_blob->w = local_90.w;
        top_blob->h = local_90.h;
        top_blob->d = local_90.d;
        top_blob->c = local_90.c;
        top_blob->cstep = local_90.cstep;
      }
      if (local_90.refcount == (int *)0x0) goto LAB_004457a6;
      LOCK();
      *local_90.refcount = *local_90.refcount + -1;
      UNLOCK();
      if (*local_90.refcount != 0) goto LAB_004457a6;
      if (local_90.allocator != (Allocator *)0x0) {
        (*(local_90.allocator)->_vptr_Allocator[3])();
        goto LAB_004457a6;
      }
    }
    else {
      if (!bVar13) goto LAB_004457a6;
      Mat::reshape(&local_90,bottom_blob,iVar9,_h,1,local_40->blob_allocator);
      if (&local_90 != top_blob) {
        if (local_90.refcount != (int *)0x0) {
          LOCK();
          *local_90.refcount = *local_90.refcount + 1;
          UNLOCK();
        }
        piVar2 = top_blob->refcount;
        if (piVar2 != (int *)0x0) {
          LOCK();
          *piVar2 = *piVar2 + -1;
          UNLOCK();
          if (*piVar2 == 0) {
            if (top_blob->allocator == (Allocator *)0x0) {
              if (top_blob->data != (void *)0x0) {
                free(top_blob->data);
              }
            }
            else {
              (*top_blob->allocator->_vptr_Allocator[3])();
            }
          }
        }
        top_blob->data = local_90.data;
        top_blob->refcount = local_90.refcount;
        top_blob->elemsize = local_90.elemsize;
        top_blob->elempack = local_90.elempack;
        top_blob->allocator = local_90.allocator;
        top_blob->dims = local_90.dims;
        top_blob->w = local_90.w;
        top_blob->h = local_90.h;
        top_blob->d = local_90.d;
        top_blob->c = local_90.c;
        top_blob->cstep = local_90.cstep;
      }
      if (local_90.refcount == (int *)0x0) goto LAB_004457a6;
      LOCK();
      *local_90.refcount = *local_90.refcount + -1;
      UNLOCK();
      if (*local_90.refcount != 0) goto LAB_004457a6;
      if (local_90.allocator != (Allocator *)0x0) {
        (*(local_90.allocator)->_vptr_Allocator[3])();
        goto LAB_004457a6;
      }
    }
  }
  else {
    if (iVar6 != 1) goto LAB_004457a6;
    if ((bool)(bVar11 & bVar12)) {
      Mat::reshape(&local_90,bottom_blob,1,iVar9,1,local_40->blob_allocator);
      if (&local_90 != top_blob) {
        if (local_90.refcount != (int *)0x0) {
          LOCK();
          *local_90.refcount = *local_90.refcount + 1;
          UNLOCK();
        }
        piVar2 = top_blob->refcount;
        if (piVar2 != (int *)0x0) {
          LOCK();
          *piVar2 = *piVar2 + -1;
          UNLOCK();
          if (*piVar2 == 0) {
            if (top_blob->allocator == (Allocator *)0x0) {
              if (top_blob->data != (void *)0x0) {
                free(top_blob->data);
              }
            }
            else {
              (*top_blob->allocator->_vptr_Allocator[3])();
            }
          }
        }
        top_blob->data = local_90.data;
        top_blob->refcount = local_90.refcount;
        top_blob->elemsize = local_90.elemsize;
        top_blob->elempack = local_90.elempack;
        top_blob->allocator = local_90.allocator;
        top_blob->dims = local_90.dims;
        top_blob->w = local_90.w;
        top_blob->h = local_90.h;
        top_blob->d = local_90.d;
        top_blob->c = local_90.c;
        top_blob->cstep = local_90.cstep;
      }
      if (local_90.refcount == (int *)0x0) goto LAB_004457a6;
      LOCK();
      *local_90.refcount = *local_90.refcount + -1;
      UNLOCK();
      if (*local_90.refcount != 0) goto LAB_004457a6;
      if (local_90.allocator != (Allocator *)0x0) {
        (*(local_90.allocator)->_vptr_Allocator[3])();
        goto LAB_004457a6;
      }
    }
    else if (bVar11) {
      Mat::reshape(&local_90,bottom_blob,1,iVar9,local_40->blob_allocator);
      if (&local_90 != top_blob) {
        if (local_90.refcount != (int *)0x0) {
          LOCK();
          *local_90.refcount = *local_90.refcount + 1;
          UNLOCK();
        }
        piVar2 = top_blob->refcount;
        if (piVar2 != (int *)0x0) {
          LOCK();
          *piVar2 = *piVar2 + -1;
          UNLOCK();
          if (*piVar2 == 0) {
            if (top_blob->allocator == (Allocator *)0x0) {
              if (top_blob->data != (void *)0x0) {
                free(top_blob->data);
              }
            }
            else {
              (*top_blob->allocator->_vptr_Allocator[3])();
            }
          }
        }
        top_blob->data = local_90.data;
        top_blob->refcount = local_90.refcount;
        top_blob->elemsize = local_90.elemsize;
        top_blob->elempack = local_90.elempack;
        top_blob->allocator = local_90.allocator;
        top_blob->dims = local_90.dims;
        top_blob->w = local_90.w;
        top_blob->h = local_90.h;
        top_blob->d = local_90.d;
        top_blob->c = local_90.c;
        top_blob->cstep = local_90.cstep;
      }
      if (local_90.refcount == (int *)0x0) goto LAB_004457a6;
      LOCK();
      *local_90.refcount = *local_90.refcount + -1;
      UNLOCK();
      if (*local_90.refcount != 0) goto LAB_004457a6;
      if (local_90.allocator != (Allocator *)0x0) {
        (*(local_90.allocator)->_vptr_Allocator[3])();
        goto LAB_004457a6;
      }
    }
    else {
      if (!bVar12) goto LAB_004457a6;
      Mat::reshape(&local_90,bottom_blob,iVar9,1,local_40->blob_allocator);
      if (&local_90 != top_blob) {
        if (local_90.refcount != (int *)0x0) {
          LOCK();
          *local_90.refcount = *local_90.refcount + 1;
          UNLOCK();
        }
        piVar2 = top_blob->refcount;
        if (piVar2 != (int *)0x0) {
          LOCK();
          *piVar2 = *piVar2 + -1;
          UNLOCK();
          if (*piVar2 == 0) {
            if (top_blob->allocator == (Allocator *)0x0) {
              if (top_blob->data != (void *)0x0) {
                free(top_blob->data);
              }
            }
            else {
              (*top_blob->allocator->_vptr_Allocator[3])();
            }
          }
        }
        top_blob->data = local_90.data;
        top_blob->refcount = local_90.refcount;
        top_blob->elemsize = local_90.elemsize;
        top_blob->elempack = local_90.elempack;
        top_blob->allocator = local_90.allocator;
        top_blob->dims = local_90.dims;
        top_blob->w = local_90.w;
        top_blob->h = local_90.h;
        top_blob->d = local_90.d;
        top_blob->c = local_90.c;
        top_blob->cstep = local_90.cstep;
      }
      if (local_90.refcount == (int *)0x0) goto LAB_004457a6;
      LOCK();
      *local_90.refcount = *local_90.refcount + -1;
      UNLOCK();
      if (*local_90.refcount != 0) goto LAB_004457a6;
      if (local_90.allocator != (Allocator *)0x0) {
        (*(local_90.allocator)->_vptr_Allocator[3])();
        goto LAB_004457a6;
      }
    }
  }
  if (local_90.data != (void *)0x0) {
    free(local_90.data);
  }
LAB_004457a6:
  if ((top_blob->data == (void *)0x0) || (iVar6 = 0, (long)top_blob->c * top_blob->cstep == 0)) {
    iVar6 = -100;
  }
  return iVar6;
}

Assistant:

int ExpandDims::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int dims = bottom_blob.dims;

    bool _expand_w = false;
    bool _expand_h = false;
    bool _expand_c = false;

    if (axes.empty())
    {
        _expand_w = expand_w;
        _expand_h = expand_h;
        _expand_c = expand_c;
    }
    else
    {
        const int* axes_ptr = axes;
        for (int i = 0; i < axes.w; i++)
        {
            int axis = axes_ptr[i];
            if (axis < 0)
                axis = dims + 1 + axis;

            if (dims == 1 && axis == 0)
            {
                _expand_h = true;
            }
            if (dims == 1 && axis == 1)
            {
                _expand_w = true;
            }
            if (dims == 2 && axis == 0)
            {
                _expand_c = true;
            }
            if (dims == 2 && axis == 1)
            {
                _expand_h = true;
            }
            if (dims == 2 && axis == 2)
            {
                _expand_w = true;
            }
        }
    }

    top_blob = bottom_blob;

    if (dims == 1)
    {
        if (_expand_w && _expand_h)
        {
            top_blob = bottom_blob.reshape(1, w, 1, opt.blob_allocator);
        }
        else if (_expand_w)
        {
            top_blob = bottom_blob.reshape(1, w, opt.blob_allocator);
        }
        else if (_expand_h)
        {
            top_blob = bottom_blob.reshape(w, 1, opt.blob_allocator);
        }
    }

    if (dims == 2)
    {
        if (_expand_w)
        {
            top_blob = bottom_blob.reshape(1, w, h, opt.blob_allocator);
        }
        else if (_expand_h)
        {
            top_blob = bottom_blob.reshape(w, 1, h, opt.blob_allocator);
        }
        else if (_expand_c)
        {
            top_blob = bottom_blob.reshape(w, h, 1, opt.blob_allocator);
        }
    }

    if (top_blob.empty())
        return -100;

    return 0;
}